

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddCryptedKey
          (DescriptorScriptPubKeyMan *this,CKeyID *key_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *crypted_key)

{
  size_t sVar1;
  mapped_type *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_90;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock74,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xa76,false);
  sVar1 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    memcpy(&local_90,pubkey,0x41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_90.second,crypted_key)
    ;
    this_00 = std::
              map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              ::operator[](&this->m_map_crypted_keys,key_id);
    std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
              (this_00,&local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_90.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock74.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddCryptedKey(const CKeyID& key_id, const CPubKey& pubkey, const std::vector<unsigned char>& crypted_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    m_map_crypted_keys[key_id] = make_pair(pubkey, crypted_key);
    return true;
}